

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Errors.hpp
# Opt level: O0

void Diligent::
     LogError<false,char[18],char_const*,char[23],unsigned_int,char[15],unsigned_int,char[16],unsigned_int,char[21],unsigned_int,char[15],char_const*,char[98]>
               (bool IsFatal,char *Function,char *FullFilePath,int Line,char (*Args) [18],
               char **Args_1,char (*Args_2) [23],uint *Args_3,char (*Args_4) [15],uint *Args_5,
               char (*Args_6) [16],uint *Args_7,char (*Args_8) [21],uint *Args_9,
               char (*Args_10) [15],char **Args_11,char (*Args_12) [98])

{
  undefined *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ostream *poVar4;
  char *pcVar5;
  char (*in_stack_fffffffffffffeb8) [98];
  undefined1 local_c0 [8];
  string Msg;
  size_type LastSlashPos;
  allocator local_81;
  string local_80 [8];
  string FileName;
  char **Args_local_1;
  char (*Args_local) [18];
  int Line_local;
  char *FullFilePath_local;
  char *Function_local;
  bool IsFatal_local;
  
  FileName.field_2._8_8_ = Args_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,FullFilePath,&local_81);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  Msg.field_2._8_8_ = std::__cxx11::string::find_last_of((char *)local_80,0xe2c3a1);
  if (Msg.field_2._8_8_ != -1) {
    std::__cxx11::string::erase((ulong)local_80,0);
  }
  FormatString<char[18],char_const*,char[23],unsigned_int,char[15],unsigned_int,char[16],unsigned_int,char[21],unsigned_int,char[15],char_const*,char[98]>
            ((string *)local_c0,(Diligent *)Args,(char (*) [18])FileName.field_2._8_8_,
             (char **)Args_2,(char (*) [23])Args_3,(uint *)Args_4,(char (*) [15])Args_5,
             (uint *)Args_6,(char (*) [16])Args_7,(uint *)Args_8,(char (*) [21])Args_9,
             (uint *)Args_10,(char (*) [15])Args_11,(char **)Args_12,in_stack_fffffffffffffeb8);
  puVar1 = DebugMessageCallback;
  if (DebugMessageCallback == (undefined *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Diligent Engine: ");
    pcVar5 = "Error";
    if (IsFatal) {
      pcVar5 = "Fatal Error";
    }
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4," in ");
    poVar4 = std::operator<<(poVar4,Function);
    poVar4 = std::operator<<(poVar4,"() (");
    poVar4 = std::operator<<(poVar4,local_80);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,Line);
    poVar4 = std::operator<<(poVar4,"): ");
    poVar4 = std::operator<<(poVar4,(string *)local_c0);
    std::operator<<(poVar4,'\n');
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::c_str();
    (*(code *)puVar1)(IsFatal | 2,uVar2,Function,uVar3,Line);
  }
  ThrowIf<false>((string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

void LogError(bool IsFatal, const char* Function, const char* FullFilePath, int Line, const ArgsType&... Args)
{
    std::string FileName(FullFilePath);

    auto LastSlashPos = FileName.find_last_of("/\\");
    if (LastSlashPos != std::string::npos)
        FileName.erase(0, LastSlashPos + 1);
    auto Msg = FormatString(Args...);
    if (DebugMessageCallback != nullptr)
    {
        DebugMessageCallback(IsFatal ? DEBUG_MESSAGE_SEVERITY_FATAL_ERROR : DEBUG_MESSAGE_SEVERITY_ERROR, Msg.c_str(), Function, FileName.c_str(), Line);
    }
    else
    {
        // No callback set - output to cerr
        std::cerr << "Diligent Engine: " << (IsFatal ? "Fatal Error" : "Error") << " in " << Function << "() (" << FileName << ", " << Line << "): " << Msg << '\n';
    }
    ThrowIf<bThrowException>(std::move(Msg));
}